

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O1

void __thiscall DebugInfo::ComputeDerivedData(DebugInfo *this)

{
  uint32_t *puVar1;
  _Rb_tree_color _Var2;
  uint32_t uVar3;
  pointer pcVar4;
  pointer pTVar5;
  pointer pTVar6;
  pointer pCVar7;
  pointer pOVar8;
  bool bVar9;
  ContribInfo *ctr;
  ulong uVar10;
  ulong uVar11;
  iterator iVar12;
  pointer pCVar13;
  ulong uVar14;
  char cVar15;
  int iVar16;
  pointer pSVar17;
  TemplateInfo info;
  string templateName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  templateToIndex;
  TemplateInfo local_c0;
  key_type local_98;
  vector<TemplateInfo,std::allocator<TemplateInfo>> *local_78;
  DebugInfo *local_70;
  pointer local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar17 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pSVar17 != local_68) {
    local_78 = (vector<TemplateInfo,std::allocator<TemplateInfo>> *)&this->m_Templates;
    local_70 = this;
    do {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar4 = (pSVar17->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar4,pcVar4 + (pSVar17->name)._M_string_length);
      cVar15 = (char)&local_98;
      uVar10 = std::__cxx11::string::find(cVar15,0x3c);
      uVar11 = uVar10;
      if (uVar10 != 0xffffffffffffffff) {
        do {
          uVar14 = uVar11 + 1;
          iVar16 = 1;
          do {
            if (local_98._M_string_length <= uVar14) break;
            iVar16 = iVar16 + (uint)(local_98._M_dataplus._M_p[uVar14] == '<');
            if ((local_98._M_dataplus._M_p[uVar14] == '>') && (iVar16 = iVar16 + -1, iVar16 == 0)) {
              iVar16 = 0;
              bVar9 = false;
            }
            else {
              uVar14 = uVar14 + 1;
              bVar9 = true;
            }
          } while (bVar9);
          if (iVar16 != 0) break;
          std::__cxx11::string::erase((ulong)&local_98,uVar11);
          std::__cxx11::string::_M_assign((string *)&local_98);
          uVar11 = std::__cxx11::string::find(cVar15,0x3c);
        } while (uVar11 != 0xffffffffffffffff);
        this = local_70;
        if (uVar10 != 0xffffffffffffffff) {
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::find(&local_60,&local_98);
          if ((_Rb_tree_header *)iVar12._M_node == &local_60._M_impl.super__Rb_tree_header) {
            pTVar5 = (this->m_Templates).
                     super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pTVar6 = (this->m_Templates).
                     super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            local_c0.name._M_dataplus._M_p = (pointer)&local_c0.name.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,local_98._M_dataplus._M_p,
                       local_98._M_dataplus._M_p + local_98._M_string_length);
            local_c0.size = (int)((ulong)((long)pTVar6 - (long)pTVar5) >> 3) * -0x33333333;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                        *)&local_60,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        *)&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
              operator_delete(local_c0.name._M_dataplus._M_p,
                              CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                       local_c0.name.field_2._M_local_buf[0]) + 1);
            }
            local_c0.name._M_dataplus._M_p = (pointer)&local_c0.name.field_2;
            local_c0.name._M_string_length = 0;
            local_c0.name.field_2._M_local_buf[0] = '\0';
            local_c0.size = 0;
            local_c0.count = 0;
            std::__cxx11::string::_M_assign((string *)&local_c0);
            local_c0.count = 1;
            local_c0.size = pSVar17->size;
            std::vector<TemplateInfo,std::allocator<TemplateInfo>>::emplace_back<TemplateInfo&>
                      (local_78,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0.name._M_dataplus._M_p != &local_c0.name.field_2) {
              operator_delete(local_c0.name._M_dataplus._M_p,
                              CONCAT71(local_c0.name.field_2._M_allocated_capacity._1_7_,
                                       local_c0.name.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            _Var2 = iVar12._M_node[2]._M_color;
            pTVar5 = (this->m_Templates).
                     super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar1 = &pTVar5[(int)_Var2].size;
            *puVar1 = *puVar1 + pSVar17->size;
            puVar1 = &pTVar5[(int)_Var2].count;
            *puVar1 = *puVar1 + 1;
          }
        }
      }
      if (pSVar17->sectionType == Data) {
        uVar3 = pSVar17->size;
        puVar1 = &(this->m_ObjectFiles).
                  super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar17->objectFileIndex].dataSize;
        *puVar1 = *puVar1 + uVar3;
        puVar1 = &(this->m_Namespaces).
                  super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar17->namespaceIndex].dataSize;
        *puVar1 = *puVar1 + uVar3;
      }
      else if (pSVar17->sectionType == Code) {
        uVar3 = pSVar17->size;
        puVar1 = &(this->m_ObjectFiles).
                  super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar17->objectFileIndex].codeSize;
        *puVar1 = *puVar1 + uVar3;
        puVar1 = &(this->m_Namespaces).
                  super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                  super__Vector_impl_data._M_start[pSVar17->namespaceIndex].codeSize;
        *puVar1 = *puVar1 + uVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 != local_68);
  }
  pCVar13 = (this->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl
            .super__Vector_impl_data._M_start;
  pCVar7 = (this->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar13 != pCVar7) {
    pOVar8 = (this->m_ObjectFiles).
             super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (pCVar13->sectionType == Data) {
        puVar1 = &pOVar8[pCVar13->objectFileIndex].contribDataSize;
        *puVar1 = *puVar1 + pCVar13->size;
      }
      else if (pCVar13->sectionType == Code) {
        puVar1 = &pOVar8[pCVar13->objectFileIndex].contribCodeSize;
        *puVar1 = *puVar1 + pCVar13->size;
      }
      pCVar13 = pCVar13 + 1;
    } while (pCVar13 != pCVar7);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DebugInfo::ComputeDerivedData()
{
    std::map<std::string, int> templateToIndex;

    for (const auto& sym : m_Symbols)
    {
        // aggregate templates
        std::string templateName = sym.name;
        bool isTemplate = StripTemplateParams(templateName);
        if (isTemplate)
        {
            auto it = templateToIndex.find(templateName);
            int index;
            if (it != templateToIndex.end())
            {
                index = it->second;
                m_Templates[index].size += sym.size;
                m_Templates[index].count++;
            }
            else
            {
                index = int(m_Templates.size());
                templateToIndex.insert(std::make_pair(templateName, index));
                TemplateInfo info;
                info.name = templateName;
                info.count = 1;
                info.size = sym.size;
                m_Templates.emplace_back(info);
            }
        }

        // aggregate object file / namespace sizes
        if (sym.sectionType == SectionType::Code)
        {
            m_ObjectFiles[sym.objectFileIndex].codeSize += sym.size;
            m_Namespaces[sym.namespaceIndex].codeSize += sym.size;
        }
        else if (sym.sectionType == SectionType::Data)
        {
            m_ObjectFiles[sym.objectFileIndex].dataSize += sym.size;
            m_Namespaces[sym.namespaceIndex].dataSize += sym.size;
        }
    }

    for (const auto& ctr : m_Contribs)
    {
        // aggregate object file / namespace sizes
        if (ctr.sectionType == SectionType::Code)
        {
            m_ObjectFiles[ctr.objectFileIndex].contribCodeSize += ctr.size;
        }
        else if (ctr.sectionType == SectionType::Data)
        {
            m_ObjectFiles[ctr.objectFileIndex].contribDataSize += ctr.size;
        }
    }
}